

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallGenerator::cmInstallGenerator
          (cmInstallGenerator *this,char *destination,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message)

{
  char *pcVar1;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"CMAKE_INSTALL_CONFIG_NAME",&local_51);
  cmScriptGenerator::cmScriptGenerator(&this->super_cmScriptGenerator,&local_50,configurations);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmScriptGenerator)._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallGenerator_0057ad10;
  if (destination == (char *)0x0) {
    destination = "";
  }
  std::__cxx11::string::string((string *)&this->Destination,destination,(allocator *)&local_50);
  pcVar1 = "";
  if (component != (char *)0x0) {
    pcVar1 = component;
  }
  std::__cxx11::string::string((string *)&this->Component,pcVar1,(allocator *)&local_50);
  this->Message = message;
  return;
}

Assistant:

cmInstallGenerator
::cmInstallGenerator(const char* destination,
                     std::vector<std::string> const& configurations,
                     const char* component,
                     MessageLevel message):
  cmScriptGenerator("CMAKE_INSTALL_CONFIG_NAME", configurations),
  Destination(destination? destination:""),
  Component(component? component:""),
  Message(message)
{
}